

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O1

BytesValue * google::protobuf::Arena::CreateMaybeMessage<google::protobuf::BytesValue>(Arena *arena)

{
  BytesValue *this;
  
  if (arena == (Arena *)0x0) {
    this = (BytesValue *)operator_new(0x20);
    (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = (void *)0x0;
    (this->super_Message).super_MessageLite._vptr_MessageLite =
         (_func_int **)&PTR__BytesValue_003c9d08;
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
    if (scc_info_BytesValue_google_2fprotobuf_2fwrappers_2eproto.base.visit_status.
        super___atomic_base<int>._M_i != 0) {
      internal::InitSCCImpl(&scc_info_BytesValue_google_2fprotobuf_2fwrappers_2eproto.base);
    }
    (this->value_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  }
  else {
    if (arena->hooks_cookie_ != (void *)0x0) {
      OnArenaAllocation(arena,(type_info *)&BytesValue::typeinfo,0x20);
    }
    this = (BytesValue *)AllocateAlignedNoHook(arena,0x20);
    BytesValue::BytesValue(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::BytesValue* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::BytesValue >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::BytesValue >(arena);
}